

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O3

int NextFile(Context *context)

{
  int iVar1;
  char *__s;
  int iVar2;
  size_t sVar3;
  FILE *__stream;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  int *piVar7;
  ulong uVar8;
  char *pcVar9;
  char *__s_00;
  
  iVar6 = context->iterator;
  iVar2 = iVar6 + 1;
  context->iterator = iVar2;
  context->input_file_length = -1;
  if (context->input_count == 0) {
    if (0 < iVar6) {
      return 0;
    }
  }
  else {
    iVar6 = context->ignore;
    if (iVar2 == context->not_input_indices[iVar6]) {
      piVar7 = context->not_input_indices + (long)iVar6 + 1;
      do {
        iVar6 = iVar6 + 1;
        iVar2 = iVar2 + 1;
        context->iterator = iVar2;
        context->ignore = iVar6;
        iVar1 = *piVar7;
        piVar7 = piVar7 + 1;
      } while (iVar2 == iVar1);
    }
    if (context->argc <= iVar2) {
      return 0;
    }
    pcVar9 = context->argv[iVar2];
    sVar3 = strlen(pcVar9);
    if ((sVar3 != 1) || (*pcVar9 != '-')) {
      context->current_input_path = pcVar9;
      __stream = fopen(pcVar9,"rb");
      uVar8 = 0xffffffffffffffff;
      if (__stream != (FILE *)0x0) {
        iVar2 = fseek(__stream,0,2);
        if (iVar2 == 0) {
          uVar8 = ftell(__stream);
          iVar2 = fclose(__stream);
          uVar8 = -(ulong)(iVar2 != 0) | uVar8;
        }
        else {
          fclose(__stream);
        }
      }
      context->input_file_length = uVar8;
      context->current_output_path = context->output_path;
      if (context->output_path != (char *)0x0) {
        return 1;
      }
      if (context->write_to_stdout != 0) {
        return 1;
      }
      strcpy(context->modified_path,pcVar9);
      pcVar9 = context->modified_path;
      context->current_output_path = pcVar9;
      if (context->decompress != 0) {
        __s = context->suffix;
        sVar3 = strlen(__s);
        pcVar4 = strrchr(pcVar9,0x2f);
        __s_00 = pcVar4 + 1;
        if (pcVar4 == (char *)0x0) {
          __s_00 = pcVar9;
        }
        pcVar4 = strrchr(__s_00,0x5c);
        pcVar9 = pcVar4 + 1;
        if (pcVar4 == (char *)0x0) {
          pcVar9 = __s_00;
        }
        sVar5 = strlen(pcVar9);
        if (sVar3 + 1 <= sVar5) {
          iVar2 = strcmp(__s,pcVar9 + (sVar5 - sVar3));
          if (iVar2 == 0) {
            pcVar9[sVar5 - sVar3] = '\0';
            return 1;
          }
          NextFile_cold_1();
          return 0;
        }
        NextFile_cold_2();
        return 0;
      }
      strcpy(pcVar9 + sVar3,context->suffix);
      return 1;
    }
  }
  context->current_input_path = (char *)0x0;
  context->current_output_path = context->output_path;
  return 1;
}

Assistant:

static BROTLI_BOOL NextFile(Context* context) {
  const char* arg;
  size_t arg_len;

  /* Iterator points to last used arg; increment to search for the next one. */
  context->iterator++;

  context->input_file_length = -1;

  /* No input path; read from console. */
  if (context->input_count == 0) {
    if (context->iterator > 1) return BROTLI_FALSE;
    context->current_input_path = NULL;
    /* Either write to the specified path, or to console. */
    context->current_output_path = context->output_path;
    return BROTLI_TRUE;
  }

  /* Skip option arguments. */
  while (context->iterator == context->not_input_indices[context->ignore]) {
    context->iterator++;
    context->ignore++;
  }

  /* All args are scanned already. */
  if (context->iterator >= context->argc) return BROTLI_FALSE;

  /* Iterator now points to the input file name. */
  arg = context->argv[context->iterator];
  arg_len = strlen(arg);
  /* Read from console. */
  if (arg_len == 1 && arg[0] == '-') {
    context->current_input_path = NULL;
    context->current_output_path = context->output_path;
    return BROTLI_TRUE;
  }

  context->current_input_path = arg;
  context->input_file_length = FileSize(arg);
  context->current_output_path = context->output_path;

  if (context->output_path) return BROTLI_TRUE;
  if (context->write_to_stdout) return BROTLI_TRUE;

  strcpy(context->modified_path, arg);
  context->current_output_path = context->modified_path;
  /* If output is not specified, input path suffix should match. */
  if (context->decompress) {
    size_t suffix_len = strlen(context->suffix);
    char* name = (char*)FileName(context->modified_path);
    char* name_suffix;
    size_t name_len = strlen(name);
    if (name_len < suffix_len + 1) {
      fprintf(stderr, "empty output file name for [%s] input file\n",
              PrintablePath(arg));
      context->iterator_error = BROTLI_TRUE;
      return BROTLI_FALSE;
    }
    name_suffix = name + name_len - suffix_len;
    if (strcmp(context->suffix, name_suffix) != 0) {
      fprintf(stderr, "input file [%s] suffix mismatch\n",
              PrintablePath(arg));
      context->iterator_error = BROTLI_TRUE;
      return BROTLI_FALSE;
    }
    name_suffix[0] = 0;
    return BROTLI_TRUE;
  } else {
    strcpy(context->modified_path + arg_len, context->suffix);
    return BROTLI_TRUE;
  }
}